

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O1

Box2i __thiscall Imf_3_4::TiledOutputFile::dataWindowForLevel(TiledOutputFile *this,int lx,int ly)

{
  long lVar1;
  int in_ECX;
  undefined4 in_register_00000034;
  Box2i BVar2;
  stringstream _iex_replace_s;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,lx) + 8);
  BVar2 = Imf_3_4::dataWindowForLevel
                    ((Imf_3_4 *)this,(TileDescription *)(lVar1 + 0x40),*(int *)(lVar1 + 0x8c),
                     *(int *)(lVar1 + 0x90),*(int *)(lVar1 + 0x94),*(int *)(lVar1 + 0x98),ly,in_ECX)
  ;
  BVar2.min = (Vec2<int>)this;
  return BVar2;
}

Assistant:

Box2i
TiledOutputFile::dataWindowForLevel (int lx, int ly) const
{
    try
    {
        return OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForLevel (
            _data->tileDesc,
            _data->minX,
            _data->maxX,
            _data->minY,
            _data->maxY,
            lx,
            ly);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error calling dataWindowForLevel() on image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}